

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBTree.cpp
# Opt level: O1

int chrono::collision::build_recurse
              (CHAABBTree *m,int bn,int first_geo,int num_geos,double envelope)

{
  vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_> *__x;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  pointer ppCVar6;
  ChGeometry *pCVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  byte bVar11;
  bool bVar12;
  uint num_geos_00;
  CHAABBTree *m_00;
  long lVar13;
  long *plVar14;
  ulong uVar15;
  CHAABB *this;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ushort uVar19;
  ushort uVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Vector baricenter;
  double local_110;
  double local_108;
  double local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  CHAABBTree *local_d0;
  long local_c8;
  double local_c0;
  double local_b8;
  vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_> local_b0;
  long local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  long local_68;
  undefined8 uStack_60;
  long local_58;
  undefined8 uStack_50;
  long local_48;
  undefined8 uStack_40;
  
  local_c8 = (long)bn * 0x38;
  this = (m->b).
         super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
         _M_impl.super__Vector_impl_data._M_start + bn;
  __x = &(m->super_ChCollisionTree).geometries;
  std::vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>::
  vector(&local_b0,__x);
  CHAABB::FitToGeometries(this,&local_b0,first_geo,num_geos,envelope);
  if (local_b0.
      super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (num_geos == 1) {
    this->first_child = ~first_geo;
  }
  else if (1 < num_geos) {
    iVar5 = m->current_box;
    this->first_child = iVar5;
    m->current_box = iVar5 + 2;
    local_e8._8_8_ = 0;
    local_e8._0_8_ = VECT_X;
    dVar1 = (this->d).m_data[0];
    local_78._8_8_ = 0;
    local_78._0_8_ = dVar1;
    dVar2 = (this->d).m_data[1];
    local_88._8_8_ = 0;
    local_88._0_8_ = dVar2;
    local_f8._8_8_ = 0;
    local_f8._0_8_ = DAT_00b90ae0;
    local_98 = VECT_Y;
    uStack_90 = 0;
    local_58 = DAT_00b90af8;
    uStack_50 = 0;
    plVar14 = (long *)&VECT_X;
    if (dVar1 < dVar2) {
      plVar14 = &VECT_Y;
    }
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (this->d).m_data[2];
    local_68 = VECT_Z;
    uStack_60 = 0;
    local_48 = DAT_00b90b10;
    uStack_40 = 0;
    uVar10 = vcmppd_avx512vl(local_88,auVar22,1);
    uVar19 = (ushort)uVar10 & 3;
    uVar10 = vcmppd_avx512vl(local_78,auVar22,1);
    uVar20 = (ushort)uVar10 & 3;
    if (((uVar20 | uVar19) & 1) != 0) {
      plVar14 = &VECT_Z;
    }
    dVar1 = (double)((ulong *)plVar14)[1];
    lVar18 = (long)first_geo;
    uVar16 = (ulong)(uint)num_geos;
    uVar15 = uVar16;
    dVar2 = VNULL;
    dVar8 = DAT_00b90ac0;
    dVar9 = DAT_00b90ac8;
    local_d0 = m;
    do {
      local_c0 = dVar9;
      local_b8 = dVar8;
      (*(__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar18]->_vptr_ChGeometry[6])(&local_110);
      dVar2 = dVar2 + local_110;
      dVar8 = local_b8 + local_108;
      dVar9 = local_c0 + local_100;
      lVar18 = lVar18 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    bVar12 = (double)local_78._0_8_ < (double)local_88._0_8_;
    bVar11 = (byte)uVar20 | (byte)uVar19;
    local_e8._0_8_ =
         (ulong)(bVar11 & 1) * local_68 +
         (ulong)!(bool)(bVar11 & 1) * ((ulong)bVar12 * local_98 + (ulong)!bVar12 * local_e8._0_8_);
    local_f8._0_8_ =
         (ulong)(bVar11 & 1) * local_48 +
         (ulong)!(bool)(bVar11 & 1) * ((ulong)bVar12 * local_58 + (ulong)!bVar12 * local_f8._0_8_);
    dVar21 = (double)num_geos;
    auVar25._0_8_ = dVar2 / dVar21;
    auVar25._8_8_ = 0;
    auVar23._0_8_ = dVar9 / dVar21;
    auVar23._8_8_ = 0;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (dVar8 / dVar21) * dVar1;
    auVar22 = vfmadd231sd_fma(auVar26,local_e8,auVar25);
    auVar22 = vfmadd231sd_fma(auVar22,local_f8,auVar23);
    lVar18 = (long)first_geo;
    uVar17 = 0;
    do {
      (*(__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar18]->_vptr_ChGeometry[6])(&local_110);
      lVar13 = local_c8;
      m_00 = local_d0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_110;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar1 * local_108;
      auVar23 = vfmadd231sd_fma(auVar24,local_e8,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_100;
      auVar23 = vfmadd231sd_fma(auVar23,local_f8,auVar4);
      if (auVar23._0_8_ <= auVar22._0_8_) {
        ppCVar6 = (__x->
                  super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pCVar7 = ppCVar6[lVar18];
        ppCVar6[lVar18] = ppCVar6[(int)(uVar17 + first_geo)];
        (__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[(int)(uVar17 + first_geo)] = pCVar7;
        uVar17 = uVar17 + 1;
      }
      lVar18 = lVar18 + 1;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
    num_geos_00 = uVar17;
    if (uVar17 == num_geos) {
      num_geos_00 = (uint)num_geos >> 1;
    }
    if (uVar17 == 0) {
      num_geos_00 = (uint)num_geos >> 1;
    }
    build_recurse(local_d0,*(int *)((long)(&((local_d0->b).
                                             super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->d + 1) +
                                   local_c8),first_geo,num_geos_00,envelope);
    build_recurse(m_00,*(int *)((long)(&((m_00->b).
                                         super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->d + 1) + lVar13
                               ) + 1,first_geo + num_geos_00,num_geos - num_geos_00,envelope);
  }
  return 0;
}

Assistant:

int build_recurse(CHAABBTree* m, int bn, int first_geo, int num_geos, double envelope) {
    CHAABB* b = m->child(bn);

    double coord;
    Vector axis;
    Vector mean;

    // fit the BV

    b->FitToGeometries(m->geometries, first_geo, num_geos, envelope);

    if (num_geos == 1) {
        // BV is a leaf BV - first_child will index a triangle

        b->first_child = -(first_geo + 1);
    } else if (num_geos > 1) {
        // BV not a leaf - first_child will index a BV

        b->first_child = m->current_box;
        m->current_box += 2;

        // choose splitting axis

        axis = VECT_X;
        if (b->d.y() > b->d.x())
            axis = VECT_Y;
        if (b->d.z() > b->d.y())
            axis = VECT_Z;
        if (b->d.z() > b->d.x())
            axis = VECT_Z;

        // choose splitting coord

        get_centroid_geometries(mean, m->geometries, first_geo, num_geos);

        coord = Vdot(axis, mean);

        //*** TO DO***??? other splitting criterion??

        // now split

        int num_first_half = split_geometries(m->geometries, first_geo, num_geos, axis, coord);

        // recursively build the children

        build_recurse(m, m->child(bn)->first_child, first_geo, num_first_half, envelope);
        build_recurse(m, m->child(bn)->first_child + 1, first_geo + num_first_half, num_geos - num_first_half,
                      envelope);
    }

    return ChC_OK;
}